

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

bool google::protobuf::anon_unknown_23::IsSubSymbol(string_view sub_symbol,string_view super_symbol)

{
  int iVar1;
  char *__s2;
  ulong __n;
  size_type __rlen;
  
  __n = sub_symbol._M_len;
  __s2 = super_symbol._M_str;
  if (__n == super_symbol._M_len) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp(sub_symbol._M_str,__s2,__n);
    if (iVar1 == 0) {
      return true;
    }
  }
  else if (__n == 0) goto LAB_00265ea7;
  if ((super_symbol._M_len < __n) || (iVar1 = bcmp(__s2,sub_symbol._M_str,__n), iVar1 != 0)) {
    return false;
  }
LAB_00265ea7:
  return __s2[__n] == '.';
}

Assistant:

bool IsSubSymbol(absl::string_view sub_symbol, absl::string_view super_symbol) {
  return sub_symbol == super_symbol ||
         (absl::StartsWith(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}